

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineTemplate.h
# Opt level: O3

void __thiscall
kiste::LineTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp>::close_exception_handling
          (LineTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp> *this,
          string *expression)

{
  if (this->data->_report_exceptions == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              (this->_serialize->_os," } catch(...) { _serialize.report_exception(__LINE__, \"",0x37
              );
    cpp::
    escape<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
              (this->_serialize,expression);
    std::__ostream_insert<char,std::char_traits<char>>
              (this->_serialize->_os,"\", std::current_exception()); } ",0x20);
    return;
  }
  return;
}

Assistant:

void close_exception_handling(const std::string& expression)
    {
      if (data._report_exceptions)
      {
      _serialize.text(" }"
                      " catch(...)"
                      " {"
                      " _serialize.report_exception(__LINE__, \"");_serialize.escape(expression);_serialize.text("\", std::current_exception());"
                      " } ");
      }
    }